

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contains_or_position.hpp
# Opt level: O0

idx_t duckdb::ListSearchNestedOp<true>
                (Vector *list_vec,Vector *source_vec,Vector *target_vec,Vector *result_vec,
                idx_t target_count)

{
  ulong uVar1;
  idx_t iVar2;
  Vector *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  ulong in_R8;
  OrderModifiers order_modifiers;
  Vector target_sort_key_vec;
  Vector source_sort_key_vec;
  idx_t source_count;
  LogicalType *this;
  OrderModifiers local_142;
  LogicalType local_140 [24];
  Vector local_128 [120];
  LogicalType local_b0 [16];
  idx_t in_stack_ffffffffffffff60;
  Vector *in_stack_ffffffffffffff68;
  Vector *in_stack_ffffffffffffff70;
  Vector *in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  
  uVar1 = duckdb::ListVector::GetListSize(in_RDI);
  this = local_b0;
  duckdb::LogicalType::LogicalType(this,BLOB);
  duckdb::Vector::Vector((Vector *)&stack0xffffffffffffff68,this,uVar1);
  duckdb::LogicalType::~LogicalType(local_b0);
  duckdb::LogicalType::LogicalType(local_140,BLOB);
  duckdb::Vector::Vector(local_128,local_140,in_R8);
  duckdb::LogicalType::~LogicalType(local_140);
  OrderModifiers::OrderModifiers(&local_142,ASCENDING,NULLS_LAST);
  duckdb::CreateSortKeyHelpers::CreateSortKeyWithValidity
            (in_RSI,(Vector *)&stack0xffffffffffffff68,&local_142,uVar1);
  duckdb::CreateSortKeyHelpers::CreateSortKeyWithValidity(in_RDX,local_128,&local_142,in_R8);
  iVar2 = ListSearchSimpleOp<duckdb::string_t,true>
                    (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  Vector::~Vector((Vector *)this);
  Vector::~Vector((Vector *)this);
  return iVar2;
}

Assistant:

idx_t ListSearchNestedOp(Vector &list_vec, Vector &source_vec, Vector &target_vec, Vector &result_vec,
                         const idx_t target_count) {
	// Set up sort keys for nested types.
	auto source_count = ListVector::GetListSize(list_vec);
	Vector source_sort_key_vec(LogicalType::BLOB, source_count);
	Vector target_sort_key_vec(LogicalType::BLOB, target_count);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
	CreateSortKeyHelpers::CreateSortKeyWithValidity(source_vec, source_sort_key_vec, order_modifiers, source_count);
	CreateSortKeyHelpers::CreateSortKeyWithValidity(target_vec, target_sort_key_vec, order_modifiers, target_count);

	return ListSearchSimpleOp<string_t, RETURN_POSITION>(list_vec, source_sort_key_vec, target_sort_key_vec, result_vec,
	                                                     target_count);
}